

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,acsdefered_t *defer,acsdefered_t *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  type val;
  EType local_1c;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    local_1c = defer->type;
    Serialize(arc,"type",&local_1c,(uint32_t *)0x0);
    defer->type = local_1c;
    pFVar2 = FSerializer::ScriptNum(arc,"script",&defer->script);
    pFVar2 = FSerializer::Array<int>(pFVar2,"args",defer->args,3,false);
    pFVar2 = Serialize(pFVar2,"player",&defer->playernum,(int32_t *)0x0);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, acsdefered_t &defer, acsdefered_t *def)
{
	if (arc.BeginObject(key))
	{
		arc.Enum("type", defer.type)
			.ScriptNum("script", defer.script)
			.Array("args", defer.args, 3)
			("player", defer.playernum)
			.EndObject();
	}
	return arc;
}